

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_suite.cpp
# Opt level: O0

void partition_array(void)

{
  type tVar1;
  reference pbVar2;
  basic_variable<std::allocator<char>_> *local_910;
  iterator local_908;
  undefined4 local_8ec;
  iterator local_8e8;
  iterator local_8d0;
  difference_type local_8b8;
  undefined1 local_8aa [2];
  iterator local_8a8;
  iterator local_890;
  undefined1 local_873 [3];
  iterator local_870;
  iterator local_858;
  undefined1 local_840 [8];
  iterator where_7;
  undefined4 local_80c;
  iterator local_808;
  iterator local_7f0;
  difference_type local_7d8;
  undefined1 local_7ca [2];
  iterator local_7c8;
  iterator local_7b0;
  undefined1 local_793 [3];
  iterator local_790;
  iterator local_778;
  undefined1 local_760 [8];
  iterator where_6;
  undefined4 local_72c;
  iterator local_728;
  iterator local_710;
  difference_type local_6f8;
  undefined1 local_6ea [2];
  iterator local_6e8;
  iterator local_6d0;
  undefined1 local_6b3 [3];
  iterator local_6b0;
  iterator local_698;
  undefined1 local_680 [8];
  iterator where_5;
  undefined4 local_64c;
  iterator local_648;
  iterator local_630;
  difference_type local_618;
  undefined1 local_60a [2];
  iterator local_608;
  iterator local_5f0;
  undefined1 local_5d3 [3];
  iterator local_5d0;
  iterator local_5b8;
  undefined1 local_5a0 [8];
  iterator where_4;
  iterator local_580;
  undefined4 local_564;
  iterator local_560;
  iterator local_548;
  difference_type local_530;
  undefined1 local_522 [2];
  iterator local_520;
  iterator local_508;
  undefined1 local_4eb [3];
  iterator local_4e8;
  iterator local_4d0;
  undefined1 local_4b8 [8];
  iterator where_3;
  iterator local_498;
  undefined4 local_47c;
  iterator local_478;
  iterator local_460;
  difference_type local_448;
  undefined1 local_43a [2];
  iterator local_438;
  iterator local_420;
  undefined1 local_403 [3];
  iterator local_400;
  iterator local_3e8;
  undefined1 local_3d0 [8];
  iterator where_2;
  iterator local_3b0;
  undefined4 local_394;
  iterator local_390;
  iterator local_378;
  difference_type local_360;
  undefined1 local_352 [2];
  iterator local_350;
  iterator local_338;
  undefined1 local_31b [3];
  iterator local_318;
  iterator local_300;
  undefined1 local_2e8 [8];
  iterator where_1;
  iterator local_2c8;
  undefined4 local_2ac;
  iterator local_2a8;
  iterator local_290;
  difference_type local_278;
  undefined1 local_26a [2];
  iterator local_268;
  iterator local_250;
  undefined1 local_233 [3];
  iterator local_230;
  iterator local_218;
  undefined1 local_200 [8];
  iterator where;
  nullable local_1d4;
  basic_variable<std::allocator<char>_> *local_1d0;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_1d0 = &local_1c8;
  local_1d4 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,&local_1d4);
  local_1d0 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_1d0,true);
  local_1d0 = &local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1d0,2);
  local_1d0 = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_1d0,3.0);
  local_1d0 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,"alpha");
  local_1d0 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,L"bravo");
  local_1d0 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,L"charlie");
  local_1d0 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,L"delta");
  local_48._0_8_ = &local_1c8;
  local_48._8_8_ = 8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_48);
  local_910 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_910 = local_910 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_910);
  } while (local_910 != &local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_218,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_230,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::nullable>>
            (local_200,&local_218,&local_230);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_230);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_250,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_268,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_233[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::nullable>>
                           (&local_250,&local_268);
  local_26a[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<nullable>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x6d,"void partition_array()",local_233,local_26a);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_268);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_250);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_290,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_2a8,(iterator *)local_200);
  local_278 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_290,&local_2a8);
  local_2ac = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x6e,"void partition_array()",&local_278,&local_2ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_290);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*(&local_2c8);
  where_1.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  tVar1 = trial::dynamic::operator==
                    (pbVar2,(nullable *)
                            &where_1.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .current.field_0xc);
  boost::detail::test_impl
            ("*data.begin() == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x6f,"void partition_array()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_300,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_318,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::boolean>>
            (local_2e8,&local_300,&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_338,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_350,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_31b[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::boolean>>
                           (&local_338,&local_350);
  local_352[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<boolean>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x73,"void partition_array()",local_31b,local_352);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_350);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_378,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_390,(iterator *)local_2e8);
  local_360 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_378,&local_390);
  local_394 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x74,"void partition_array()",&local_360,&local_394);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_390);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_378);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3b0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*(&local_3b0);
  where_2.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._15_1_ = 1;
  tVar1 = trial::dynamic::operator==
                    (pbVar2,(bool *)&where_2.
                                     super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                                     .current.field_0xf);
  boost::detail::test_impl
            ("*data.begin() == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x75,"void partition_array()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_400,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::integer>>
            (local_3d0,&local_3e8,&local_400);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_400);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_420,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_438,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_403[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::integer>>
                           (&local_420,&local_438);
  local_43a[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<integer>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x79,"void partition_array()",local_403,local_43a);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_420);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_460,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_478,(iterator *)local_3d0);
  local_448 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_460,&local_478);
  local_47c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x7a,"void partition_array()",&local_448,&local_47c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_478);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_460);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_498,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*(&local_498);
  where_3.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 2;
  tVar1 = trial::dynamic::operator==
                    (pbVar2,(int *)&where_3.
                                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                                    .current.field_0xc);
  boost::detail::test_impl
            ("*data.begin() == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x7b,"void partition_array()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_3d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_4e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::real>>
            (local_4b8,&local_4d0,&local_4e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_508,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_520,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_4eb[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::real>>
                           (&local_508,&local_520);
  local_522[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<real>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x7f,"void partition_array()",local_4eb,local_522);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_520);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_508);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_548,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_560,(iterator *)local_4b8);
  local_530 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_548,&local_560);
  local_564 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x80,"void partition_array()",&local_530,&local_564);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_560);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_548);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_580,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*(&local_580);
  where_4.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current.current = '\0';
  where_4.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._9_7_ = 0x40080000000000;
  tVar1 = trial::dynamic::operator==
                    (pbVar2,(double *)
                            &where_4.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .current.current);
  boost::detail::test_impl
            ("*data.begin() == 3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x81,"void partition_array()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_580);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_4b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::string>>
            (local_5a0,&local_5b8,&local_5d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_608,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_5d3[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::string>>
                           (&local_5f0,&local_608);
  local_60a[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<string>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x85,"void partition_array()",local_5d3,local_60a);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_608);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_630,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_648,(iterator *)local_5a0);
  local_618 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_630,&local_648);
  local_64c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x86,"void partition_array()",&local_618,&local_64c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_648);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_630);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)
                      &where_5.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current);
  tVar1 = trial::dynamic::operator==(pbVar2,(char (*) [6])"alpha");
  boost::detail::test_impl
            ("*data.begin() == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x87,"void partition_array()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_5a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_698,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_6b0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::wstring>>
            (local_680,&local_698,&local_6b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_698);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_6e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_6b3[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::wstring>>
                           (&local_6d0,&local_6e8);
  local_6ea[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<wstring>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x8b,"void partition_array()",local_6b3,local_6ea);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_710,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_728,(iterator *)local_680);
  local_6f8 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_710,&local_728);
  local_72c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x8c,"void partition_array()",&local_6f8,&local_72c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_728);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_710);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)
                      &where_6.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current);
  tVar1 = trial::dynamic::operator==(pbVar2,(wchar_t (*) [6])L"bravo");
  boost::detail::test_impl
            ("*data.begin() == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x8d,"void partition_array()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_680);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_778,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_790,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::u16string>>
            (local_760,&local_778,&local_790);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_790);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_778);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_7b0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_7c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_793[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::u16string>>
                           (&local_7b0,&local_7c8);
  local_7ca[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<u16string>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x91,"void partition_array()",local_793,local_7ca);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_7f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_808,(iterator *)local_760);
  local_7d8 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_7f0,&local_808);
  local_80c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x92,"void partition_array()",&local_7d8,&local_80c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_808);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)
                      &where_7.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current);
  tVar1 = trial::dynamic::operator==(pbVar2,(char16_t (*) [8])L"charlie");
  boost::detail::test_impl
            ("*data.begin() == u\"charlie\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x93,"void partition_array()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_760);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_858,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_870,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::u32string>>
            (local_840,&local_858,&local_870);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_870);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_890,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_8a8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_873[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::u32string>>
                           (&local_890,&local_8a8);
  local_8aa[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<u32string>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x97,"void partition_array()",local_873,local_8aa);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_890);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_8e8,(iterator *)local_840);
  local_8b8 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_8d0,&local_8e8);
  local_8ec = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x98,"void partition_array()",&local_8b8,&local_8ec);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_908,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*(&local_908);
  tVar1 = trial::dynamic::operator==(pbVar2,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("*data.begin() == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_suite.cpp"
             ,0x99,"void partition_array()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_908);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_840);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void partition_array()
{
    variable data = { null, true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" };
    {
        auto where = std::partition(data.begin(), data.end(), is<nullable>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<nullable>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(*data.begin() == null);
    }
    {
        auto where = std::partition(data.begin(), data.end(), is<boolean>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<boolean>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(*data.begin() == true);
    }
    {
        auto where = std::partition(data.begin(), data.end(), is<integer>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<integer>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(*data.begin() == 2);
    }
    {
        auto where = std::partition(data.begin(), data.end(), is<real>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<real>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(*data.begin() == 3.0);
    }
    {
        auto where = std::partition(data.begin(), data.end(), is<string>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<string>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(*data.begin() == "alpha");
    }
    {
        auto where = std::partition(data.begin(), data.end(), is<wstring>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<wstring>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(*data.begin() == L"bravo");
    }
    {
        auto where = std::partition(data.begin(), data.end(), is<u16string>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<u16string>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(*data.begin() == u"charlie");
    }
    {
        auto where = std::partition(data.begin(), data.end(), is<u32string>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<u32string>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(*data.begin() == U"delta");
    }
}